

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t is_symlink(char *file,wchar_t line,char *pathname,char *contents)

{
  int iVar1;
  ssize_t sVar2;
  char *fmt;
  stat st;
  char buff [300];
  stat sStack_1e8;
  char local_158 [304];
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = lstat(pathname,&sStack_1e8);
  if (iVar1 == 0) {
    if ((sStack_1e8.st_mode & 0xf000) != 0xa000) {
      return L'\0';
    }
    if (contents == (char *)0x0) {
      return L'\x01';
    }
    sVar2 = readlink(pathname,local_158,300);
    if (-1 < sVar2) {
      local_158[sVar2] = '\0';
      iVar1 = strcmp(local_158,contents);
      return (uint)(iVar1 == 0);
    }
    fmt = "Can\'t read symlink %s";
  }
  else {
    fmt = "Symlink should exist: %s";
  }
  failure_start(file,line,fmt,pathname);
  failure_finish(file);
  return L'\0';
}

Assistant:

static int
is_symlink(const char *file, int line,
    const char *pathname, const char *contents)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)pathname; /* UNUSED */
	(void)contents; /* UNUSED */
	assertion_count(file, line);
	/* Windows sort-of has real symlinks, but they're only usable
	 * by privileged users and are crippled even then, so there's
	 * really not much point in bothering with this. */
	return (0);
#else
	char buff[300];
	struct stat st;
	ssize_t linklen;
	int r;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line,
		    "Symlink should exist: %s", pathname);
		failure_finish(NULL);
		return (0);
	}
	if (!S_ISLNK(st.st_mode))
		return (0);
	if (contents == NULL)
		return (1);
	linklen = readlink(pathname, buff, sizeof(buff));
	if (linklen < 0) {
		failure_start(file, line, "Can't read symlink %s", pathname);
		failure_finish(NULL);
		return (0);
	}
	buff[linklen] = '\0';
	if (strcmp(buff, contents) != 0)
		return (0);
	return (1);
#endif
}